

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

NodeAndBucket __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
FindHelper(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ViewType k)

{
  NodeBase **ppNVar1;
  int iVar2;
  uint64_t uVar3;
  uintptr_t v_1;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  NodeBase *__n;
  NodeBase *pNVar7;
  uchar *bytes;
  uint64_t v;
  NodeAndBucket NVar8;
  
  __n = (NodeBase *)k._M_len;
  AssertLoadFactor(this);
  uVar3 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                    (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,k._M_str,__n);
  uVar5 = (uVar3 ^ (ulong)__n) * -0x234dd359734ecb13;
  ppNVar1 = (this->super_UntypedMapBase).table_;
  uVar5 = ((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38) ^ (ulong)ppNVar1) * -0x234dd359734ecb13;
  lVar6 = ((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38) ^ (ulong)ppNVar1) * -0x234dd359734ecb13;
  uVar4 = ((uint)(byte)((ulong)lVar6 >> 0x38) | ((uint)((ulong)lVar6 >> 0x20) & 0xff0000) >> 8 |
           (uint)((ulong)lVar6 >> 0x18) & 0xff0000 | (uint)((ulong)lVar6 >> 8) & 0xff000000) &
          (this->super_UntypedMapBase).num_buckets_ - 1;
  for (pNVar7 = ppNVar1[uVar4]; pNVar7 != (NodeBase *)0x0; pNVar7 = pNVar7->next) {
    if (pNVar7[2].next == __n) {
      if (__n == (NodeBase *)0x0) goto LAB_0072b00f;
      iVar2 = bcmp(pNVar7[1].next,k._M_str,(size_t)__n);
      if (iVar2 == 0) goto LAB_0072b00f;
    }
  }
  pNVar7 = (NodeBase *)0x0;
LAB_0072b00f:
  NVar8.bucket = uVar4;
  NVar8.node = pNVar7;
  NVar8._12_4_ = 0;
  return NVar8;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k) const {
    AssertLoadFactor();
    map_index_t b = BucketNumber(k);
    for (auto* node = table_[b]; node != nullptr; node = node->next) {
      if (TS::ToView(static_cast<KeyNode*>(node)->key()) == k) {
        return {node, b};
      }
    }
    return {nullptr, b};
  }